

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# badfp.c
# Opt level: O1

int main(int argc,char **argv)

{
  code ****ppppcVar1;
  int iVar2;
  code ***local_38;
  void *addr;
  
  local_38 = (code ***)0x0;
  ppppcVar1 = (code ****)local_38;
  while( true ) {
    do {
      local_38 = (code ***)ppppcVar1;
      iVar2 = getopt(argc,argv,"dh");
      ppppcVar1 = &local_38;
    } while (iVar2 == 100);
    if (iVar2 != 0x68) break;
    signal(0xb,sighandle);
    ppppcVar1 = (code ****)local_38;
  }
  if (iVar2 != -1) {
    abort();
  }
  (*(code *)local_38)();
  return 0;
}

Assistant:

int
main(int argc, char *argv[])
{
   int c;
   void *addr = 0;
   while ((c = getopt(argc, argv, "dh")) != -1) {
      switch (c) {
         case 'h': // handle the fault with a signal handler.
            signal(SIGSEGV, sighandle);
            break;
         case 'd': // handle the fault with a signal handler.
            addr = &addr;
            break;
         default:
            abort();
      }
   }

   void (*f)(void) = addr;
   f();
}